

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O3

int anon_unknown.dwarf_1d3ff::skip_input_output_arg(char *arg,char *input_fname)

{
  int iVar1;
  
  iVar1 = strcmp(arg,input_fname);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    if ((((*arg != '-') || (arg[1] != 'o')) || (arg[2] != '\0')) &&
       (iVar1 = strcmp(arg,"--output"), iVar1 != 0)) {
      iVar1 = strncmp(arg,"--output=",9);
      return (uint)(iVar1 == 0);
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int skip_input_output_arg(const char *arg, const char *input_fname) {
  if (strcmp(arg, input_fname) == 0) {
    return 1;
  }
  if (strcmp(arg, "-o") == 0 || strcmp(arg, "--output") == 0) {
    return 2;
  }
  if (strncmp(arg, "--output=", strlen("--output=")) == 0) {
    return 1;
  }
  return 0;
}